

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

char * __thiscall glslang::HlslGrammar::getTypeString(HlslGrammar *this,EHlslTokenClass tokenClass)

{
  EHlslTokenClass tokenClass_local;
  HlslGrammar *this_local;
  
  if (tokenClass == EHTokSample) {
    this_local = (HlslGrammar *)0xe80686;
  }
  else if (tokenClass == EHTokLayout) {
    this_local = (HlslGrammar *)0xe44514;
  }
  else if (tokenClass == EHTokBool) {
    this_local = (HlslGrammar *)0xece657;
  }
  else if (tokenClass == EHTokInt) {
    this_local = (HlslGrammar *)0xec4ec9;
  }
  else if (tokenClass == EHTokUint) {
    this_local = (HlslGrammar *)0xec4dd1;
  }
  else if (tokenClass == EHTokHalf) {
    this_local = (HlslGrammar *)0xee9de2;
  }
  else if (tokenClass == EHTokFloat) {
    this_local = (HlslGrammar *)0xec4cd7;
  }
  else if (tokenClass == EHTokDouble) {
    this_local = (HlslGrammar *)0xe874f9;
  }
  else if (tokenClass == EHTokMin16float) {
    this_local = (HlslGrammar *)anon_var_dwarf_8c4ca1;
  }
  else if (tokenClass == EHTokMin10float) {
    this_local = (HlslGrammar *)anon_var_dwarf_8c4d97;
  }
  else if (tokenClass == EHTokMin16int) {
    this_local = (HlslGrammar *)anon_var_dwarf_8c4e69;
  }
  else if (tokenClass == EHTokMin12int) {
    this_local = (HlslGrammar *)anon_var_dwarf_8c4f5c;
  }
  else if (tokenClass == EHTokHalf1x1) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c2d;
  }
  else if (tokenClass == EHTokHalf1x2) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c39;
  }
  else if (tokenClass == EHTokHalf1x3) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c45;
  }
  else if (tokenClass == EHTokHalf1x4) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c51;
  }
  else if (tokenClass == EHTokHalf2x1) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c5d;
  }
  else if (tokenClass == EHTokHalf2x2) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c69;
  }
  else if (tokenClass == EHTokHalf2x3) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c75;
  }
  else if (tokenClass == EHTokHalf2x4) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c81;
  }
  else if (tokenClass == EHTokHalf3x1) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c8d;
  }
  else if (tokenClass == EHTokHalf3x2) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93c99;
  }
  else if (tokenClass == EHTokHalf3x3) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93ca5;
  }
  else if (tokenClass == EHTokHalf3x4) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93cb1;
  }
  else if (tokenClass == EHTokHalf4x1) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93cbd;
  }
  else if (tokenClass == EHTokHalf4x2) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93cc9;
  }
  else if (tokenClass == EHTokHalf4x3) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93cd5;
  }
  else if (tokenClass == EHTokHalf4x4) {
    this_local = (HlslGrammar *)anon_var_dwarf_a93ce1;
  }
  else if (tokenClass == EHTokConstantBuffer) {
    this_local = (HlslGrammar *)0xe91587;
  }
  else {
    this_local = (HlslGrammar *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* HlslGrammar::getTypeString(EHlslTokenClass tokenClass) const
{
    switch (tokenClass) {
    case EHTokSample:     return "sample";
    case EHTokHalf:       return "half";
    case EHTokHalf1x1:    return "half1x1";
    case EHTokHalf1x2:    return "half1x2";
    case EHTokHalf1x3:    return "half1x3";
    case EHTokHalf1x4:    return "half1x4";
    case EHTokHalf2x1:    return "half2x1";
    case EHTokHalf2x2:    return "half2x2";
    case EHTokHalf2x3:    return "half2x3";
    case EHTokHalf2x4:    return "half2x4";
    case EHTokHalf3x1:    return "half3x1";
    case EHTokHalf3x2:    return "half3x2";
    case EHTokHalf3x3:    return "half3x3";
    case EHTokHalf3x4:    return "half3x4";
    case EHTokHalf4x1:    return "half4x1";
    case EHTokHalf4x2:    return "half4x2";
    case EHTokHalf4x3:    return "half4x3";
    case EHTokHalf4x4:    return "half4x4";
    case EHTokBool:       return "bool";
    case EHTokFloat:      return "float";
    case EHTokDouble:     return "double";
    case EHTokInt:        return "int";
    case EHTokUint:       return "uint";
    case EHTokMin16float: return "min16float";
    case EHTokMin10float: return "min10float";
    case EHTokMin16int:   return "min16int";
    case EHTokMin12int:   return "min12int";
    case EHTokConstantBuffer: return "ConstantBuffer";
    case EHTokLayout:     return "layout";
    default:
        return nullptr;
    }
}